

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::MatrixMultiply::forward_impl
          (MatrixMultiply *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  size_type sVar2;
  const_reference ppTVar3;
  uint *puVar4;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  bool bVar5;
  uint b;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe68;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *other;
  undefined4 in_stack_fffffffffffffe88;
  uint uVar6;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  *in_stack_fffffffffffffe90;
  Tensor *in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffea4;
  Tensor *in_stack_fffffffffffffea8;
  uint local_c4;
  
  sVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar2 != 2) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x57c,
                  "virtual void cnn::MatrixMultiply::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar6 = *(uint *)(in_RDX + 0x20);
  ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  other = (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
           *)&((*ppTVar3)->d).bd;
  ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,1);
  puVar4 = std::max<unsigned_int>((uint *)other,&((*ppTVar3)->d).bd);
  if (uVar6 != *puVar4) {
    __assert_fail("fx.d.bd == max(xs[0]->d.bd, xs[1]->d.bd)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x581,
                  "virtual void cnn::MatrixMultiply::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  if (((*ppTVar3)->d).bd == 1) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::operator*(in_stack_fffffffffffffe98);
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
    Tensor::colbatch_matrix(in_stack_fffffffffffffea8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator*((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)CONCAT44(uVar6,in_stack_fffffffffffffe88),other);
    Tensor::colbatch_matrix(in_stack_fffffffffffffea8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::noalias(in_stack_fffffffffffffe68);
    Eigen::
    NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator=(in_stack_fffffffffffffe90,
              (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
               *)CONCAT44(uVar6,in_stack_fffffffffffffe88));
  }
  else {
    ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,1);
    bVar5 = true;
    if (((*ppTVar3)->d).bd != 1) {
      ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                          (in_RSI,1);
      uVar1 = ((*ppTVar3)->d).bd;
      ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                          (in_RSI,0);
      bVar5 = uVar1 == ((*ppTVar3)->d).bd;
    }
    if (!bVar5) {
      __assert_fail("xs[1]->d.bd == 1 || xs[1]->d.bd == xs[0]->d.bd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x589,
                    "virtual void cnn::MatrixMultiply::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    for (local_c4 = 0;
        ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                            (in_RSI,0), local_c4 < ((*ppTVar3)->d).bd; local_c4 = local_c4 + 1) {
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
      Tensor::batch_matrix(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
      Tensor::batch_matrix(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator*((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)CONCAT44(uVar6,in_stack_fffffffffffffe88),other);
      Tensor::batch_matrix(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Eigen::
      MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      noalias(in_stack_fffffffffffffe68);
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator=(in_stack_fffffffffffffe90,
                  (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                   *)CONCAT44(uVar6,in_stack_fffffffffffffe88));
    }
  }
  return;
}

Assistant:

void MatrixMultiply::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 2);
#if HAVE_CUDA
  // fx = 0*fx + xs[0] * xs[1]
  CUDAMatrixMultiply(*xs[0], *xs[1], fx, kSCALAR_ZERO);
#else
  assert(fx.d.bd == max(xs[0]->d.bd, xs[1]->d.bd));
  if(xs[0]->d.bd == 1) {
    // If the left side has one batch, multiply by columns
    // [x, z, b] = [x, y] * [y, z, b]
    // -> [x, z*b] = [x, y], [y, z*b]
    fx.colbatch_matrix().noalias() = **xs[0] * xs[1]->colbatch_matrix();
  } else {
    // Otherwise, loop over the batches
    assert(xs[1]->d.bd == 1 || xs[1]->d.bd == xs[0]->d.bd);
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      fx.batch_matrix(b).noalias() = xs[0]->batch_matrix(b) * xs[1]->batch_matrix(b);
  }
#endif
}